

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O0

void __thiscall
ScriptHash_ScriptHash_hex_exception_Test::TestBody(ScriptHash_ScriptHash_hex_exception_Test *this)

{
  bool bVar1;
  char *message;
  char *in_R9;
  string local_d8;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CfdException *cfd_except;
  ScriptHash script_hash;
  allocator local_31;
  undefined1 local_30 [8];
  string hex;
  ScriptHash_ScriptHash_hex_exception_Test *this_local;
  
  hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"xxxx",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ScriptHash::ScriptHash((ScriptHash *)&cfd_except,(string *)local_30);
  cfd::core::ScriptHash::~ScriptHash((ScriptHash *)&cfd_except);
  std::__cxx11::string::~string((string *)local_30);
  local_a1 = false;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)local_a0,(AssertionResult *)0x6a1860,"false","true",in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_scripthash.cpp"
               ,0x25,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex_exception) {
  try {
    std::string hex("xxxx");
    ScriptHash script_hash(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}